

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::_q_udpSocketReadNotification(QSocks5SocketEnginePrivate *this)

{
  bool bVar1;
  qint64 qVar2;
  int *pPos;
  qsizetype qVar3;
  QHostAddress *in_RDI;
  long in_FS_OFFSET;
  char *buf;
  int pos;
  QByteArray inBuf;
  QByteArray sealedBuf;
  QSocks5RevivedDatagram datagram;
  QSocks5RevivedDatagram *in_stack_ffffffffffffff48;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar4;
  QHostAddress *pAddress;
  QByteArray *in_stack_ffffffffffffff80;
  Data *local_60;
  quint16 *in_stack_ffffffffffffffa8;
  QHostAddress *in_stack_ffffffffffffffb0;
  Data *maxSize;
  char *data;
  QUdpSocket *this_00;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pAddress = in_RDI;
  bVar1 = QUdpSocket::hasPendingDatagrams((QUdpSocket *)in_stack_ffffffffffffff50);
  if (bVar1) {
    while (bVar1 = QUdpSocket::hasPendingDatagrams((QUdpSocket *)in_stack_ffffffffffffff50), bVar1)
    {
      maxSize = (Data *)0xaaaaaaaaaaaaaaaa;
      data = (char *)0xaaaaaaaaaaaaaaaa;
      this_00 = (QUdpSocket *)0xaaaaaaaaaaaaaaaa;
      qVar2 = QUdpSocket::pendingDatagramSize((QUdpSocket *)in_stack_ffffffffffffff50);
      QByteArray::QByteArray((QByteArray *)&stack0xffffffffffffffb8,qVar2,'\0');
      in_stack_ffffffffffffff50 =
           (QSocks5SocketEnginePrivate *)((in_RDI[0x21].d.d.ptr)->scopeId).d.ptr;
      QByteArray::data((QByteArray *)in_stack_ffffffffffffff50);
      QByteArray::size((QByteArray *)&stack0xffffffffffffffb8);
      QUdpSocket::readDatagram
                (this_00,data,(qint64)maxSize,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_60 = (Data *)0xaaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffffa8 = (quint16 *)0xaaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffffb0 = (QHostAddress *)0xaaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)0x373015);
      bVar1 = QSocks5Authenticator::unSeal
                        ((QSocks5Authenticator *)in_stack_ffffffffffffff50,
                         &in_stack_ffffffffffffff48->data,(QByteArray *)0x373034);
      if (bVar1) {
        pPos = (int *)QByteArray::constData((QByteArray *)0x373057);
        qVar3 = QByteArray::size((QByteArray *)&local_60);
        if (qVar3 < 4) {
          iVar4 = 1;
        }
        else {
          memset(local_30,0xaa,0x28);
          QSocks5RevivedDatagram::QSocks5RevivedDatagram
                    ((QSocks5RevivedDatagram *)in_stack_ffffffffffffff50);
          if (((char)*pPos == '\0') && (*(char *)((long)pPos + 1) == '\0')) {
            if (*(char *)((long)pPos + 2) == '\0') {
              iVar4 = qt_socks5_get_host_address_and_port
                                (in_stack_ffffffffffffff80,pAddress,
                                 (quint16 *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pPos)
              ;
              if (iVar4 == 1) {
                in_stack_ffffffffffffff48 = (QSocks5RevivedDatagram *)((long)pPos + 3);
                qVar3 = QByteArray::size((QByteArray *)&local_60);
                QByteArray::QByteArray
                          ((QByteArray *)&stack0xffffffffffffff80,(char *)in_stack_ffffffffffffff48,
                           qVar3 + -3);
                QByteArray::operator=
                          ((QByteArray *)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->data)
                ;
                QByteArray::~QByteArray((QByteArray *)0x373197);
                QQueue<QSocks5RevivedDatagram>::enqueue
                          ((QQueue<QSocks5RevivedDatagram> *)in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48);
                iVar4 = 0;
              }
              else {
                iVar4 = 1;
              }
            }
            else {
              iVar4 = 1;
            }
          }
          else {
            iVar4 = 1;
          }
          QSocks5RevivedDatagram::~QSocks5RevivedDatagram
                    ((QSocks5RevivedDatagram *)in_stack_ffffffffffffff50);
        }
      }
      else {
        iVar4 = 1;
      }
      QByteArray::~QByteArray((QByteArray *)0x3731d3);
      QByteArray::~QByteArray((QByteArray *)0x3731dd);
      if (iVar4 != 0) goto LAB_003731f8;
      in_stack_ffffffffffffff74 = 0;
    }
    emitReadNotification(in_stack_ffffffffffffff50);
  }
LAB_003731f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::_q_udpSocketReadNotification()
{
    QSOCKS5_D_DEBUG << "_q_udpSocketReadNotification()";

    // check some state stuff
    if (!udpData->udpSocket->hasPendingDatagrams()) {
        QSOCKS5_D_DEBUG << "false read ??";
        return;
    }

    while (udpData->udpSocket->hasPendingDatagrams()) {
        QByteArray sealedBuf(udpData->udpSocket->pendingDatagramSize(), 0);
        QSOCKS5_D_DEBUG << "new datagram";
        udpData->udpSocket->readDatagram(sealedBuf.data(), sealedBuf.size());
        QByteArray inBuf;
        if (!data->authenticator->unSeal(sealedBuf, &inBuf)) {
            QSOCKS5_D_DEBUG << "failed unsealing datagram discarding";
            return;
        }
        QSOCKS5_DEBUG << dump(inBuf);
        int pos = 0;
        const char *buf = inBuf.constData();
        if (inBuf.size() < 4) {
            QSOCKS5_D_DEBUG << "bogus udp data, discarding";
            return;
        }
        QSocks5RevivedDatagram datagram;
        if (buf[pos++] != 0 || buf[pos++] != 0) {
            QSOCKS5_D_DEBUG << "invalid datagram discarding";
            return;
        }
        if (buf[pos++] != 0) { //### add fragmentation reading support
            QSOCKS5_D_DEBUG << "don't support fragmentation yet disgarding";
            return;
        }
        if (qt_socks5_get_host_address_and_port(inBuf, &datagram.address, &datagram.port, &pos) != 1) {
            QSOCKS5_D_DEBUG << "failed to get address from datagram disgarding";
            return;
        }
        datagram.data = QByteArray(&buf[pos], inBuf.size() - pos);
        udpData->pendingDatagrams.enqueue(datagram);
    }
    emitReadNotification();
}